

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O0

void __thiscall Console::Prompt::Private::handleOutput(Private *this,int fd,int originalFd)

{
  code *pcVar1;
  int iVar2;
  String local_1048;
  usize local_1020;
  ssize i;
  char buffer [4096];
  int originalFd_local;
  int fd_local;
  Private *this_local;
  
  buffer._4088_4_ = originalFd;
  buffer._4092_4_ = fd;
  promptClear(this);
  restoreCursorPosition(this);
  restoreTerminalMode(this);
  local_1020 = read(buffer._4092_4_,&i,0x1000);
  if (local_1020 == 0xffffffffffffffff) {
    iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                          ,0x3f3,"i != -1");
    if (iVar2 != 0) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  writeConsole(this,(char *)&i,local_1020);
  flushConsole(this);
  enableTerminalRawMode(this);
  saveCursorPosition(this);
  String::String(&local_1048);
  promptWrite(this,0,&local_1048);
  String::~String(&local_1048);
  return;
}

Assistant:

void handleOutput(int fd, int originalFd)
#endif
  {
#ifdef _MSC_VER
    // get new output
    DWORD read;
    if(!GetOverlappedResult(hStdRead, &overlapped, &read, FALSE))
      return;
#endif

    // restore console
    promptClear();
    restoreCursorPosition();
    restoreTerminalMode();

    // add new output
#ifdef _MSC_VER
    DWORD written;
    VERIFY(WriteConsole(hOriginalStd, buffer, read / sizeof(char), &written, NULL));
    ASSERT(written == read / sizeof(char));
    while(ReadFile(hStdRead, buffer, (DWORD)bufferSize, &read, &overlapped))
    {
      VERIFY(WriteConsole(hOriginalStd, buffer, read / sizeof(char), &written, NULL));
      ASSERT(written == read / sizeof(char));
    }
#else
    char buffer[4096];
    ssize i = read(fd, buffer, sizeof(buffer));
    VERIFY(i != -1);
    writeConsole(buffer, i); // todo: write to originalFd and ensure utf8 sequences are valid
    flushConsole();
#endif

    // add prompt
    enableTerminalRawMode();
    saveCursorPosition();
    promptWrite();
  }